

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::Write3dmAnonymousUserTableRecord
          (ON_BinaryArchive *this,ON_UUID plugin_id,int goo_3dm_version,uint goo_opennurbs_version,
          ON_3dmGoo *goo)

{
  int iVar1;
  ON_UUID application_id;
  ON_UUID item_id;
  ON_UUID plugin_id_00;
  bool bVar2;
  size_t sVar3;
  ON_UUID local_30;
  
  local_30.Data4 = plugin_id.Data4;
  local_30._0_8_ = plugin_id._0_8_;
  bVar2 = ON_UuidIsNil(&local_30);
  if (!bVar2) {
    item_id.Data4[0] = local_30.Data4[0];
    item_id.Data4[1] = local_30.Data4[1];
    item_id.Data4[2] = local_30.Data4[2];
    item_id.Data4[3] = local_30.Data4[3];
    item_id.Data4[4] = local_30.Data4[4];
    item_id.Data4[5] = local_30.Data4[5];
    item_id.Data4[6] = local_30.Data4[6];
    item_id.Data4[7] = local_30.Data4[7];
    item_id.Data1 = local_30.Data1;
    item_id.Data2 = local_30.Data2;
    item_id.Data3 = local_30.Data3;
    application_id.Data4[0] = local_30.Data4[0];
    application_id.Data4[1] = local_30.Data4[1];
    application_id.Data4[2] = local_30.Data4[2];
    application_id.Data4[3] = local_30.Data4[3];
    application_id.Data4[4] = local_30.Data4[4];
    application_id.Data4[5] = local_30.Data4[5];
    application_id.Data4[6] = local_30.Data4[6];
    application_id.Data4[7] = local_30.Data4[7];
    application_id.Data1 = local_30.Data1;
    application_id.Data2 = local_30.Data2;
    application_id.Data3 = local_30.Data3;
    bVar2 = ShouldSerializeUserDataItem(this,application_id,item_id);
    if (goo_3dm_version < 4) {
      return false;
    }
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_VersionNumberIsValid(goo_opennurbs_version);
    if (bVar2) {
      if (goo->m_typecode != 0x20000081) {
        return false;
      }
    }
    else {
      bVar2 = ON_VersionNumberIsYearMonthDateFormat(goo_3dm_version,goo_opennurbs_version);
      if (!bVar2) {
        return false;
      }
      if (goo->m_typecode != 0x20000081) {
        return false;
      }
    }
    if (((goo->m_value != 0) && (goo->m_goo != (uchar *)0x0)) &&
       (plugin_id_00.Data4[0] = local_30.Data4[0], plugin_id_00.Data4[1] = local_30.Data4[1],
       plugin_id_00.Data4[2] = local_30.Data4[2], plugin_id_00.Data4[3] = local_30.Data4[3],
       plugin_id_00.Data4[4] = local_30.Data4[4], plugin_id_00.Data4[5] = local_30.Data4[5],
       plugin_id_00.Data4[6] = local_30.Data4[6], plugin_id_00.Data4[7] = local_30.Data4[7],
       plugin_id_00.Data1 = local_30.Data1, plugin_id_00.Data2 = local_30.Data2,
       plugin_id_00.Data3 = local_30.Data3,
       bVar2 = BeginWrite3dmUserTable(this,plugin_id_00,true,goo_3dm_version,goo_opennurbs_version),
       bVar2)) {
      iVar1 = goo->m_value;
      sVar3 = Write(this,(long)iVar1,goo->m_goo);
      bVar2 = EndWrite3dmUserTable(this);
      return bVar2 && sVar3 == (long)iVar1;
    }
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::Write3dmAnonymousUserTableRecord( 
    ON_UUID plugin_id,
    int goo_3dm_version,
    unsigned int goo_opennurbs_version,
    const ON_3dmGoo& goo
    )
{
  if ( ON_UuidIsNil(plugin_id) )
    return false;
  
  if (false == ShouldSerializeUserDataItem(plugin_id, plugin_id))
    return false;

  if ( goo_3dm_version <= 3 )
    return false;
  if (   !ON_VersionNumberIsValid(goo_opennurbs_version) 
      && !ON_VersionNumberIsYearMonthDateFormat(goo_3dm_version,goo_opennurbs_version)
     )
  {
    return false;
  }
  if ( goo.m_typecode != TCODE_USER_RECORD )
    return false;
  if ( 0 == goo.m_value )
    return false;
  if ( 0 == goo.m_goo )
    return false;
  bool bSavingGoo = true;
  if ( !BeginWrite3dmUserTable( plugin_id, bSavingGoo, goo_3dm_version, goo_opennurbs_version ) )
    return false;
  bool rc = WriteByte( goo.m_value, goo.m_goo );
  if ( !EndWrite3dmUserTable() )
    rc = false;
  return rc;
}